

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

STRING_HANDLE STRING_construct_sprintf(char *format,...)

{
  char in_AL;
  int iVar1;
  STRING_HANDLE __ptr;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  LOGGER_LOG local_140;
  undefined1 local_138 [8];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  LOGGER_LOG local_80;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t malloc_size;
  undefined4 local_48;
  int length;
  va_list arg_list;
  char *buf;
  size_t maxBufSize;
  STRING *result;
  char *format_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_130 = in_RSI;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  if (format == (char *)0x0) {
    local_80 = xlogging_get_log_function();
    if (local_80 != (LOGGER_LOG)0x0) {
      (*local_80)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                  ,"STRING_construct_sprintf",0xbe,1,"Failure: invalid argument.");
    }
    maxBufSize = 0;
  }
  else {
    arg_list[0].overflow_arg_area = local_138;
    arg_list[0]._0_8_ = &stack0x00000008;
    length = 0x30;
    local_48 = 8;
    malloc_size._4_4_ = vsnprintf((char *)0x0,0,format,&local_48);
    if ((int)malloc_size._4_4_ < 1) {
      if (malloc_size._4_4_ == 0) {
        maxBufSize = (size_t)STRING_new();
      }
      else {
        maxBufSize = 0;
        l_4 = xlogging_get_log_function();
        if (l_4 != (LOGGER_LOG)0x0) {
          (*l_4)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                 ,"STRING_construct_sprintf",0xb9,1,"Failure: vsnprintf return 0 length");
        }
      }
    }
    else {
      __ptr = (STRING_HANDLE)malloc(8);
      if (__ptr == (STRING_HANDLE)0x0) {
        l_3 = xlogging_get_log_function();
        maxBufSize = 0;
        if (l_3 != (LOGGER_LOG)0x0) {
          (*l_3)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                 ,"STRING_construct_sprintf",0xae,1,"Failure: allocation failed.");
        }
      }
      else {
        if (malloc_size._4_4_ < 0xfffffffe) {
          local_140 = (LOGGER_LOG)((long)(int)malloc_size._4_4_ + 1);
        }
        else {
          local_140 = (LOGGER_LOG)0xffffffffffffffff;
        }
        l = local_140;
        if (local_140 != (LOGGER_LOG)0xffffffffffffffff) {
          pcVar2 = (char *)malloc((size_t)local_140);
          __ptr->s = pcVar2;
          if (pcVar2 != (char *)0x0) {
            arg_list[0].overflow_arg_area = local_138;
            arg_list[0]._0_8_ = &stack0x00000008;
            length = 0x30;
            local_48 = 8;
            iVar1 = vsnprintf(__ptr->s,(size_t)l,format,&local_48);
            if (-1 < iVar1) {
              return __ptr;
            }
            free(__ptr->s);
            free(__ptr);
            l_1 = xlogging_get_log_function();
            if (l_1 == (LOGGER_LOG)0x0) {
              return (STRING_HANDLE)0x0;
            }
            (*l_1)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                   ,"STRING_construct_sprintf",0xa0,1,"Failure: vsnprintf formatting failed.");
            return (STRING_HANDLE)0x0;
          }
        }
        free(__ptr);
        maxBufSize = 0;
        l_2 = xlogging_get_log_function();
        if (l_2 != (LOGGER_LOG)0x0) {
          (*l_2)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                 ,"STRING_construct_sprintf",0xa9,1,
                 "Failure: allocation sprintf value failed. size=%zu",l);
        }
      }
    }
  }
  return (STRING_HANDLE)maxBufSize;
}

Assistant:

__attribute__((format(printf, 1, 2)))
#endif
STRING_HANDLE STRING_construct_sprintf(const char* format, ...)
{
    STRING* result;

#ifdef STRINGS_C_SPRINTF_BUFFER_SIZE
    size_t maxBufSize = STRINGS_C_SPRINTF_BUFFER_SIZE;
    char buf[STRINGS_C_SPRINTF_BUFFER_SIZE];
#else
    size_t maxBufSize = 0;
    char* buf = NULL;
#endif

    if (format != NULL)
    {
        va_list arg_list;
        int length;
        va_start(arg_list, format);

        /* Codes_SRS_STRING_07_041: [STRING_construct_sprintf shall determine the size of the resulting string and allocate the necessary memory.] */
        length = vsnprintf(buf, maxBufSize, format, arg_list);
        va_end(arg_list);
        if (length > 0)
        {
            result = (STRING*)malloc(sizeof(STRING));
            if (result != NULL)
            {
                size_t malloc_size = safe_add_size_t((size_t)length, 1);
                if (malloc_size != SIZE_MAX && (result->s = (char*)malloc(malloc_size)) != NULL)
                {
                    va_start(arg_list, format);
                    if (vsnprintf(result->s, malloc_size, format, arg_list) < 0)
                    {
                        /* Codes_SRS_STRING_07_040: [If any error is encountered STRING_construct_sprintf shall return NULL.] */
                        free(result->s);
                        free(result);
                        result = NULL;
                        LogError("Failure: vsnprintf formatting failed.");
                    }
                    va_end(arg_list);
                }
                else
                {
                    /* Codes_SRS_STRING_07_040: [If any error is encountered STRING_construct_sprintf shall return NULL.] */
                    free(result);
                    result = NULL;
                    LogError("Failure: allocation sprintf value failed. size=%zu", malloc_size);
                }
            }
            else
            {
                LogError("Failure: allocation failed.");
            }
        }
        else if (length == 0)
        {
            result = (STRING*)STRING_new();
        }
        else
        {
            /* Codes_SRS_STRING_07_039: [If the parameter format is NULL then STRING_construct_sprintf shall return NULL.] */
            result = NULL;
            LogError("Failure: vsnprintf return 0 length");
        }
    }
    else
    {
        LogError("Failure: invalid argument.");
        result = NULL;
    }
    /* Codes_SRS_STRING_07_045: [STRING_construct_sprintf shall allocate a new string with the value of the specified printf formated const char. ] */
    return (STRING_HANDLE)result;
}